

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall capnp::SchemaLoader::loadNative(SchemaLoader *this,RawSchema *nativeSchema)

{
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> local_20;
  
  kj::_::Mutex::lock((Mutex *)this,EXCLUSIVE);
  local_20.ptr = &(this->impl).value;
  local_20.mutex = (Mutex *)this;
  Impl::loadNative((this->impl).value.ptr,nativeSchema);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked(&local_20);
  return;
}

Assistant:

void SchemaLoader::loadNative(const _::RawSchema* nativeSchema) {
  impl.lockExclusive()->get()->loadNative(nativeSchema);
}